

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O3

void __thiscall FIR::stopband(FIR *this,int M,double f1,double f2)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  setTaps(this,M);
  std::vector<float,_std::allocator<float>_>::resize(&this->freq,2);
  if ((((0.5 < f2) || (f1 < 0.0)) || (0.5 < f1)) || (f2 < 0.0)) {
    puts("\nThe frequencies are not normalized");
    return;
  }
  setFreq(this,f1,0);
  setFreq(this,f2,1);
  this->type = 's';
  if (1 < this->taps) {
    uVar2 = this->taps / 2;
    lVar3 = 0;
    do {
      iVar1 = -uVar2 + (int)lVar3;
      if (iVar1 == 0) {
        if (this->taps <= (int)uVar2) goto LAB_0011a03e;
        (this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] =
             (float)((f2 * -6.283185307179586 + f1 * 6.283185307179586) / 3.141592653589793 + 1.0);
      }
      else {
        dVar6 = (double)iVar1;
        dVar4 = sin(f1 * 6.283185307179586 * dVar6);
        dVar5 = sin(f2 * 6.283185307179586 * dVar6);
        if ((int)lVar3 < this->taps) {
          (this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] =
               (float)((dVar4 - dVar5) / (dVar6 * 3.141592653589793));
        }
        else {
LAB_0011a03e:
          puts("\nThat coefficient does not exist");
        }
      }
      lVar3 = lVar3 + 1;
    } while ((int)(-uVar2 + (int)lVar3) < (int)uVar2);
  }
  return;
}

Assistant:

void FIR::stopband(int M, double f1, double f2){

	this->setTaps(M);

	freq.resize(2);

	if (f1<0.0 or f1>0.5 or f2<0.0 or f2>0.5){printf("\nThe frequencies are not normalized\n");}
	else{
		this->setFreq(f1,0);
		this->setFreq(f2,1);
		this->setType('s');
		int M=this->getTaps();
		
		for (int i=-int(M/2); i<int(M/2); i++){
			if (i==0) {
				this->setCoeff(1+((2*M_PI*f1)-(2*M_PI*f2))/M_PI,i+int(M/2));
			}else{		
				this->setCoeff(((sin(2*M_PI*f1*i)-sin(2*M_PI*f2*i))/(i*M_PI)),i+int(M/2));
			}
		}
	}
}